

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall higan::EventLoop::CallPendingFunc(EventLoop *this)

{
  undefined1 local_70 [8];
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  pending;
  MutexLockGuard guard;
  
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::queue<std::deque<std::function<void()>,std::allocator<std::function<void()>>>,void>
            ((queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
              *)local_70);
  MutexLockGuard::MutexLockGuard
            ((MutexLockGuard *)
             &pending.c.
              super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node,&this->mutex_);
  std::
  swap<std::_Deque_base<std::function<void()>,std::allocator<std::function<void()>>>::_Deque_impl_data>
            ((_Deque_impl_data *)local_70,(_Deque_impl_data *)&this->pending_func_queue_);
  MutexLockGuard::~MutexLockGuard
            ((MutexLockGuard *)
             &pending.c.
              super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node);
  while (pending.c.
         super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl
         .super__Deque_impl_data._M_start._M_node !=
         (_Map_pointer)
         pending.c.
         super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl
         .super__Deque_impl_data._M_map_size) {
    std::function<void_()>::operator()
              ((function<void_()> *)
               pending.c.
               super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
               _M_impl.super__Deque_impl_data._M_map_size);
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
              ((deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)local_70);
  }
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            ((deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)local_70);
  return;
}

Assistant:

void EventLoop::CallPendingFunc()
{
	std::queue<EventLoopFunc> pending;

	{
		/**
		 * muduo这里太妙了 swap之后 立刻释放锁 对CallPendingFunc和RunInLoop影响都很小
		 * 如果不进行拷贝 而是加锁后直接处理pending_func_queue_会对RunInLoop产生较大影响
		 */
		MutexLockGuard guard(mutex_);
		pending.swap(pending_func_queue_);
	}

	while (!pending.empty())
	{
		pending.front()();
		pending.pop();
	}
}